

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChLinkRevoluteTranslational::Get_react_torque_body2(ChLinkRevoluteTranslational *this)

{
  ChVector<double> *in_RDI;
  
  in_RDI->m_data[0] = VNULL;
  in_RDI->m_data[1] = DAT_00b90ac0;
  in_RDI->m_data[2] = DAT_00b90ac8;
  return in_RDI;
}

Assistant:

ChVector<> ChLinkRevoluteTranslational::Get_react_torque_body2() {
    ////
    ////  TODO
    ////

    // Calculate the reaction torques on Body 2 in the joint frame at the spherical joint
    // (Note: the joint frame x-axis is along the vector from the
    //  point on body 1 to the point on body 2.  The z axis is along the revolute
    //  axis defined for the joint)
    //  react_torque = (0,0,0)
    return VNULL;
}